

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O0

self_ * __thiscall standards::exp_number<float>::operator/=(exp_number<float> *this,self_ *rhs)

{
  range_error *this_00;
  float *in_RSI;
  self_ *in_RDI;
  float extraout_XMM0_Da;
  
  if (in_RDI->sign_ != 0) {
    if (in_RSI[1] == 0.0) {
      this_00 = (range_error *)__cxa_allocate_exception(0x10);
      std::range_error::range_error(this_00,"exp_number::operator/=()");
      __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
    }
    in_RDI->log_ = in_RDI->log_ - *in_RSI;
    in_RDI->sign_ = (int)in_RSI[1] * in_RDI->sign_;
    std::abs((int)in_RDI);
    if (extraout_XMM0_Da < 1e-10) {
      in_RDI->log_ = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

self_& operator/=(self_ const& rhs) {
    if (sign_ != is_zero) {
      if (rhs.sign_ != is_zero) {
        log_ -= rhs.log_;
        sign_ *= rhs.sign_;
        if (std::abs(log_/rhs.log_) < 1.0e-10) log_ = 0;
      } else {
        throw std::range_error("exp_number::operator/=()");
      }
    }
    return *this;
  }